

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O2

double calculateLogProposalDistributionValue
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *thetaDestination,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *phiDestination,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *alphaSource,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *betaSource)

{
  pointer pvVar1;
  int d;
  ulong uVar2;
  int k;
  long lVar3;
  double dVar4;
  double local_a8;
  _Vector_base<double,_std::allocator<double>_> local_90;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_a8 = 0.0;
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    pvVar1 = (thetaDestination->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(thetaDestination->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar2)
    break;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,
               (vector<double,_std::allocator<double>_> *)
               ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar3));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_78,
               (vector<double,_std::allocator<double>_> *)
               ((long)&(((alphaSource->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar3));
    dVar4 = calculateDirichletLogPdf
                      ((vector<double,_std::allocator<double>_> *)&local_48,
                       (vector<double,_std::allocator<double>_> *)&local_78);
    local_a8 = local_a8 + dVar4;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x18;
  }
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    pvVar1 = (phiDestination->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(phiDestination->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar2)
    break;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_60,
               (vector<double,_std::allocator<double>_> *)
               ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar3));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_90,
               (vector<double,_std::allocator<double>_> *)
               ((long)&(((betaSource->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar3));
    dVar4 = calculateDirichletLogPdf
                      ((vector<double,_std::allocator<double>_> *)&local_60,
                       (vector<double,_std::allocator<double>_> *)&local_90);
    local_a8 = local_a8 + dVar4;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x18;
  }
  return local_a8;
}

Assistant:

double calculateLogProposalDistributionValue(const vector<vector<double> > &thetaDestination, const vector<vector<double> > &phiDestination, const vector<vector<double>> alphaSource, const vector<vector<double>> betaSource){
    double logPriorDistributionValue = 0.0;
    for(int d=0; d<thetaDestination.size(); d++){
        logPriorDistributionValue += calculateDirichletLogPdf(thetaDestination[d], alphaSource[d]);
    }
    for(int k=0; k<phiDestination.size(); k++){
        logPriorDistributionValue += calculateDirichletLogPdf(phiDestination[k], betaSource[k]);
    }
    return logPriorDistributionValue;
}